

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_math.c
# Opt level: O1

sunrealtype SUNRpowerI(sunrealtype base,int exponent)

{
  int iVar1;
  sunrealtype sVar2;
  
  sVar2 = 1.0;
  if (exponent != 0) {
    iVar1 = -exponent;
    if (0 < exponent) {
      iVar1 = exponent;
    }
    sVar2 = 1.0;
    do {
      sVar2 = sVar2 * base;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  if (exponent < 0) {
    sVar2 = 1.0 / sVar2;
  }
  return sVar2;
}

Assistant:

sunrealtype SUNRpowerI(sunrealtype base, int exponent)
{
  int i, expt;
  sunrealtype prod;

  prod = SUN_RCONST(1.0);
  expt = abs(exponent);
  for (i = 1; i <= expt; i++) { prod *= base; }
  if (exponent < 0) { prod = SUN_RCONST(1.0) / prod; }
  return (prod);
}